

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::refreshSystemReverbParameters(Synth *this)

{
  byte bVar1;
  BReverbModel *pBVar2;
  bool bVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  BReverbModel *oldReverbModel;
  Synth *this_local;
  
  if ((this->reverbOverridden & 1U) == 0) {
    bVar1 = (this->mt32ram->system).reverbMode;
    (*this->reportHandler->_vptr_ReportHandler[0xb])
              (this->reportHandler,(ulong)bVar1,in_RDX,CONCAT71((int7)((ulong)in_RCX >> 8),bVar1));
    (*this->reportHandler->_vptr_ReportHandler[0xc])
              (this->reportHandler,(ulong)(this->mt32ram->system).reverbTime);
    (*this->reportHandler->_vptr_ReportHandler[0xd])
              (this->reportHandler,(ulong)(this->mt32ram->system).reverbLevel);
    pBVar2 = this->reverbModel;
    if (((this->mt32ram->system).reverbTime == '\0') &&
       ((this->mt32ram->system).reverbLevel == '\0')) {
      this->reverbModel = (BReverbModel *)0x0;
    }
    else {
      this->reverbModel = this->reverbModels[(this->mt32ram->system).reverbMode];
    }
    if (this->reverbModel != pBVar2) {
      if ((this->extensions->preallocatedReverbMemory & 1U) == 0) {
        if (pBVar2 != (BReverbModel *)0x0) {
          (*pBVar2->_vptr_BReverbModel[4])();
        }
        bVar3 = isReverbEnabled(this);
        if (bVar3) {
          (*this->reverbModel->_vptr_BReverbModel[3])();
        }
      }
      else {
        bVar3 = isReverbEnabled(this);
        if (bVar3) {
          (*this->reverbModel->_vptr_BReverbModel[5])();
        }
      }
    }
    bVar3 = isReverbEnabled(this);
    if (bVar3) {
      (*this->reverbModel->_vptr_BReverbModel[6])
                (this->reverbModel,(ulong)(this->mt32ram->system).reverbTime,
                 (ulong)(this->mt32ram->system).reverbLevel);
    }
  }
  return;
}

Assistant:

void Synth::refreshSystemReverbParameters() {
#if MT32EMU_MONITOR_SYSEX > 0
	printDebug(" Reverb: mode=%d, time=%d, level=%d", mt32ram.system.reverbMode, mt32ram.system.reverbTime, mt32ram.system.reverbLevel);
#endif
	if (reverbOverridden) {
#if MT32EMU_MONITOR_SYSEX > 0
		printDebug(" (Reverb overridden - ignoring)");
#endif
		return;
	}
	reportHandler->onNewReverbMode(mt32ram.system.reverbMode);
	reportHandler->onNewReverbTime(mt32ram.system.reverbTime);
	reportHandler->onNewReverbLevel(mt32ram.system.reverbLevel);

	BReverbModel *oldReverbModel = reverbModel;
	if (mt32ram.system.reverbTime == 0 && mt32ram.system.reverbLevel == 0) {
		// Setting both time and level to 0 effectively disables wet reverb output on real devices.
		// Take a shortcut in this case to reduce CPU load.
		reverbModel = NULL;
	} else {
		reverbModel = reverbModels[mt32ram.system.reverbMode];
	}
	if (reverbModel != oldReverbModel) {
		if (extensions.preallocatedReverbMemory) {
			if (isReverbEnabled()) {
				reverbModel->mute();
			}
		} else {
			if (oldReverbModel != NULL) {
				oldReverbModel->close();
			}
			if (isReverbEnabled()) {
				reverbModel->open();
			}
		}
	}
	if (isReverbEnabled()) {
		reverbModel->setParameters(mt32ram.system.reverbTime, mt32ram.system.reverbLevel);
	}
}